

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O2

int get_byte(gz_stream *s)

{
  byte *pbVar1;
  uInt uVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  gz_stream *pgVar6;
  uint uVar7;
  
  uVar7 = 0xffffffff;
  if (s->z_eof == 0) {
    uVar2 = (s->stream).avail_in;
    pgVar6 = s;
    if (uVar2 == 0) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      sVar5 = fread(s->inbuf,1,0x4000,(FILE *)s->file);
      uVar2 = (uInt)sVar5;
      (s->stream).avail_in = uVar2;
      if (uVar2 == 0) {
        s->z_eof = 1;
        iVar3 = ferror((FILE *)s->file);
        if (iVar3 == 0) {
          return -1;
        }
        s->z_err = -1;
        return -1;
      }
      pgVar6 = (gz_stream *)&s->inbuf;
    }
    pbVar1 = (pgVar6->stream).next_in;
    (s->stream).avail_in = uVar2 - 1;
    (s->stream).next_in = pbVar1 + 1;
    uVar7 = (uint)*pbVar1;
  }
  return uVar7;
}

Assistant:

local int get_byte(s)
    gz_stream *s;
{
    if (s->z_eof) return EOF;
    if (s->stream.avail_in == 0) {
        errno = 0;
        s->stream.avail_in = (uInt)fread(s->inbuf, 1, Z_BUFSIZE, s->file);
        if (s->stream.avail_in == 0) {
            s->z_eof = 1;
            if (ferror(s->file)) s->z_err = Z_ERRNO;
            return EOF;
        }
        s->stream.next_in = s->inbuf;
    }
    s->stream.avail_in--;
    return *(s->stream.next_in)++;
}